

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O3

void __thiscall
Minisat::Heap<int,_Minisat::Solver::VarOrderLt,_Minisat::MkIndexDefault<int>_>::insert
          (Heap<int,_Minisat::Solver::VarOrderLt,_Minisat::MkIndexDefault<int>_> *this,int k)

{
  int local_20 [2];
  
  local_20[1] = 0xffffffff;
  local_20[0] = k;
  vec<int,_int>::growTo(&(this->indices).map,k + 1,local_20 + 1);
  if (k < (this->indices).map.sz) {
    if (-1 < (this->indices).map.data[k]) {
      __assert_fail("!inHeap(k)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/Heap.h"
                    ,0x66,
                    "void Minisat::Heap<int, Minisat::Solver::VarOrderLt>::insert(K) [K = int, Comp = Minisat::Solver::VarOrderLt, MkIndex = Minisat::MkIndexDefault<int>]"
                   );
    }
    (this->indices).map.data[k] = (this->heap).sz;
    vec<int,_int>::push(&this->heap,local_20);
    if (local_20[0] < (this->indices).map.sz) {
      percolateUp(this,(this->indices).map.data[local_20[0]]);
      return;
    }
  }
  __assert_fail("has(k)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/IntMap.h"
                ,0x28,
                "V &Minisat::IntMap<int, int>::operator[](K) [K = int, V = int, MkIndex = Minisat::MkIndexDefault<int>]"
               );
}

Assistant:

void insert(K k)
    {
        indices.reserve(k, -1);
        assert(!inHeap(k));

        indices[k] = heap.size();
        heap.push(k);
        percolateUp(indices[k]);
    }